

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int do_build(int ac,char **av)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  char *local_540;
  char *local_530;
  anon_class_8_1_3fcf6528 local_518;
  ProgressCallbackType local_510;
  anon_class_8_1_3fcf6528 local_4f0;
  MessageCallback local_4e8;
  undefined1 local_4c8 [8];
  cmake cm;
  unsigned_long local_138;
  unsigned_long numJobs;
  string parallel;
  string local_108;
  string local_e8;
  char *local_c8;
  char *nextArg_1;
  char *nextArg;
  int local_b0;
  int i;
  Doing doing;
  bool verbose;
  bool foundNonClean;
  bool foundClean;
  bool cleanFirst;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  string dir;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  int jobs;
  char **av_local;
  int ac_local;
  
  targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&config.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"Debug",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::string
            ((string *)
             &nativeOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&doing);
  i._3_1_ = 0;
  i._2_1_ = 0;
  i._1_1_ = 0;
  i._0_1_ = cmsys::SystemTools::HasEnv("VERBOSE");
  local_b0 = 1;
  for (nextArg._4_4_ = 2; nextArg._4_4_ < ac; nextArg._4_4_ = nextArg._4_4_ + 1) {
    if (local_b0 == 4) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&doing,
                 av + nextArg._4_4_);
    }
    else {
      bVar1 = cmHasLiteralPrefix<char_const*,3ul>(av + nextArg._4_4_,(char (*) [3])"-j");
      if (bVar1) {
        if (nextArg._4_4_ + 1 < ac) {
          local_530 = av[nextArg._4_4_ + 1];
        }
        else {
          local_530 = (char *)0x0;
        }
        nextArg_1 = local_530;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             anon_unknown.dwarf_a31f::extract_job_number
                       ((int *)((long)&nextArg + 4),av[nextArg._4_4_],local_530,2);
        if (targets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
          std::__cxx11::string::clear();
        }
        local_b0 = 0;
      }
      else {
        bVar1 = cmHasLiteralPrefix<char_const*,11ul>(av + nextArg._4_4_,(char (*) [11])"--parallel")
        ;
        if (bVar1) {
          if (nextArg._4_4_ + 1 < ac) {
            local_540 = av[nextArg._4_4_ + 1];
          }
          else {
            local_540 = (char *)0x0;
          }
          local_c8 = local_540;
          targets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               anon_unknown.dwarf_a31f::extract_job_number
                         ((int *)((long)&nextArg + 4),av[nextArg._4_4_],local_540,10);
          if (targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
            std::__cxx11::string::clear();
          }
          local_b0 = 0;
        }
        else {
          iVar2 = strcmp(av[nextArg._4_4_],"--target");
          if ((iVar2 == 0) || (iVar2 = strcmp(av[nextArg._4_4_],"-t"), iVar2 == 0)) {
            local_b0 = 2;
          }
          else {
            iVar2 = strcmp(av[nextArg._4_4_],"--config");
            if (iVar2 == 0) {
              local_b0 = 3;
            }
            else {
              iVar2 = strcmp(av[nextArg._4_4_],"--clean-first");
              if (iVar2 == 0) {
                i._3_1_ = 1;
                local_b0 = 0;
              }
              else {
                iVar2 = strcmp(av[nextArg._4_4_],"--verbose");
                if ((iVar2 == 0) || (iVar2 = strcmp(av[nextArg._4_4_],"-v"), iVar2 == 0)) {
                  i._0_1_ = 1;
                  local_b0 = 0;
                }
                else {
                  iVar2 = strcmp(av[nextArg._4_4_],"--use-stderr");
                  if (iVar2 != 0) {
                    iVar2 = strcmp(av[nextArg._4_4_],"--");
                    if (iVar2 == 0) {
                      local_b0 = 4;
                    }
                    else if (local_b0 == 1) {
                      pcVar5 = av[nextArg._4_4_];
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_108,pcVar5,
                                 (allocator<char> *)(parallel.field_2._M_local_buf + 0xf));
                      cmsys::SystemTools::CollapseFullPath(&local_e8,&local_108);
                      std::__cxx11::string::operator=
                                ((string *)
                                 &nativeOptions.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (string *)&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&local_108);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(parallel.field_2._M_local_buf + 0xf));
                      local_b0 = 0;
                    }
                    else if (local_b0 == 2) {
                      sVar3 = strlen(av[nextArg._4_4_]);
                      if (sVar3 == 0) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"Warning: Argument number ");
                        poVar4 = (ostream *)std::ostream::operator<<(poVar4,nextArg._4_4_);
                        poVar4 = std::operator<<(poVar4," after --target option is empty.");
                        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                      }
                      else {
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*const&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)(config.field_2._M_local_buf + 8),av + nextArg._4_4_);
                        iVar2 = strcmp(av[nextArg._4_4_],"clean");
                        if (iVar2 == 0) {
                          i._2_1_ = 1;
                        }
                        else {
                          i._1_1_ = 1;
                        }
                      }
                      if (((i._2_1_ & 1) != 0) && ((i._1_1_ & 1) != 0)) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,
                                                 "Error: Building \'clean\' and other targets together is not supported."
                                                );
                        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                        std::__cxx11::string::clear();
                      }
                    }
                    else if (local_b0 == 3) {
                      std::__cxx11::string::operator=((string *)local_58,av[nextArg._4_4_]);
                      local_b0 = 0;
                    }
                    else {
                      poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
                      poVar4 = std::operator<<(poVar4,av[nextArg._4_4_]);
                      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                      std::__cxx11::string::clear();
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (targets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
    std::__cxx11::string::string((string *)&numJobs);
    bVar1 = cmsys::SystemTools::GetEnv("CMAKE_BUILD_PARALLEL_LEVEL",(string *)&numJobs);
    if (bVar1) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_138 = 0;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmSystemTools::StringToULong(pcVar5,&local_138);
        if (bVar1) {
          if (local_138 == 0) {
            std::operator<<((ostream *)&std::cerr,
                            "The CMAKE_BUILD_PARALLEL_LEVEL environment variable requires a positive integer argument.\n\n"
                           );
            std::__cxx11::string::clear();
          }
          else if (local_138 < 0x80000000) {
            targets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)local_138;
          }
          else {
            std::operator<<((ostream *)&std::cerr,
                            "The CMAKE_BUILD_PARALLEL_LEVEL environment variable is too large.\n\n")
            ;
            std::__cxx11::string::clear();
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "\'CMAKE_BUILD_PARALLEL_LEVEL\' environment variable\n");
          poVar4 = std::operator<<(poVar4,"invalid number \'");
          poVar4 = std::operator<<(poVar4,(string *)&numJobs);
          std::operator<<(poVar4,"\' given.\n\n");
          std::__cxx11::string::clear();
        }
      }
      else {
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)&numJobs);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cmake::cmake((cmake *)local_4c8,RoleInternal,Project);
    local_4f0.cm = (cmake *)local_4c8;
    std::function<void(std::__cxx11::string_const&,char_const*)>::
    function<do_build(int,char_const*const*)::__0,void>
              ((function<void(std::__cxx11::string_const&,char_const*)> *)&local_4e8,&local_4f0);
    cmSystemTools::SetMessageCallback(&local_4e8);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
    ::~function(&local_4e8);
    local_518.cm = (cmake *)local_4c8;
    std::function<void(std::__cxx11::string_const&,float)>::
    function<do_build(int,char_const*const*)::__1,void>
              ((function<void(std::__cxx11::string_const&,float)> *)&local_510,&local_518);
    cmake::SetProgressCallback((cmake *)local_4c8,&local_510);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
    ::~function(&local_510);
    av_local._4_4_ =
         cmake::Build((cmake *)local_4c8,
                      targets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                      (string *)
                      &nativeOptions.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&config.field_2 + 8),(string *)local_58,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&doing,(bool)(i._3_1_ & 1),(bool)((byte)i & 1));
    cm._900_4_ = 1;
    cmake::~cmake((cmake *)local_4c8);
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --parallel [<jobs>], -j [<jobs>]\n                 = Build in parallel using the given number of jobs. \n                   If <jobs> is omitted the native build tool\'s \n                   default number is used.\n                   The CMAKE_BUILD_PARALLEL_LEVEL environment variable\n                   specifies a default parallel level when this option\n                   is not given.\n  --target <tgt>..., -t <tgt>... \n                 = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --verbose, -v  = Enable verbose output - if supported - including\n                   the build commands to be executed. \n  --             = Pass remaining options to the native tool.\n"
                   );
    av_local._4_4_ = 1;
    cm._900_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&doing);
  std::__cxx11::string::~string
            ((string *)
             &nativeOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  return av_local._4_4_;
}

Assistant:

static int do_build(int ac, char const* const* av)
{
#ifndef CMAKE_BUILD_WITH_CMAKE
  std::cerr << "This cmake does not support --build\n";
  return -1;
#else
  int jobs = cmake::NO_BUILD_PARALLEL_LEVEL;
  std::vector<std::string> targets;
  std::string config = "Debug";
  std::string dir;
  std::vector<std::string> nativeOptions;
  bool cleanFirst = false;
  bool foundClean = false;
  bool foundNonClean = false;
  bool verbose = cmSystemTools::HasEnv("VERBOSE");

  enum Doing
  {
    DoingNone,
    DoingDir,
    DoingTarget,
    DoingConfig,
    DoingNative
  };
  Doing doing = DoingDir;
  for (int i = 2; i < ac; ++i) {
    if (doing == DoingNative) {
      nativeOptions.emplace_back(av[i]);
    } else if (cmHasLiteralPrefix(av[i], "-j")) {
      const char* nextArg = ((i + 1 < ac) ? av[i + 1] : nullptr);
      jobs = extract_job_number(i, av[i], nextArg, sizeof("-j") - 1);
      if (jobs < 0) {
        dir.clear();
      }
      doing = DoingNone;
    } else if (cmHasLiteralPrefix(av[i], "--parallel")) {
      const char* nextArg = ((i + 1 < ac) ? av[i + 1] : nullptr);
      jobs = extract_job_number(i, av[i], nextArg, sizeof("--parallel") - 1);
      if (jobs < 0) {
        dir.clear();
      }
      doing = DoingNone;
    } else if ((strcmp(av[i], "--target") == 0) ||
               (strcmp(av[i], "-t") == 0)) {
      doing = DoingTarget;
    } else if (strcmp(av[i], "--config") == 0) {
      doing = DoingConfig;
    } else if (strcmp(av[i], "--clean-first") == 0) {
      cleanFirst = true;
      doing = DoingNone;
    } else if ((strcmp(av[i], "--verbose") == 0) ||
               (strcmp(av[i], "-v") == 0)) {
      verbose = true;
      doing = DoingNone;
    } else if (strcmp(av[i], "--use-stderr") == 0) {
      /* tolerate legacy option */
    } else if (strcmp(av[i], "--") == 0) {
      doing = DoingNative;
    } else {
      switch (doing) {
        case DoingDir:
          dir = cmSystemTools::CollapseFullPath(av[i]);
          doing = DoingNone;
          break;
        case DoingTarget:
          if (strlen(av[i]) == 0) {
            std::cerr << "Warning: Argument number " << i
                      << " after --target option is empty." << std::endl;
          } else {
            targets.emplace_back(av[i]);
            if (strcmp(av[i], "clean") == 0) {
              foundClean = true;
            } else {
              foundNonClean = true;
            }
          }
          if (foundClean && foundNonClean) {
            std::cerr << "Error: Building 'clean' and other targets together "
                         "is not supported."
                      << std::endl;
            dir.clear();
          }
          break;
        case DoingConfig:
          config = av[i];
          doing = DoingNone;
          break;
        default:
          std::cerr << "Unknown argument " << av[i] << std::endl;
          dir.clear();
          break;
      }
    }
  }

  if (jobs == cmake::NO_BUILD_PARALLEL_LEVEL) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CMAKE_BUILD_PARALLEL_LEVEL", parallel)) {
      if (parallel.empty()) {
        jobs = cmake::DEFAULT_BUILD_PARALLEL_LEVEL;
      } else {
        unsigned long numJobs = 0;
        if (cmSystemTools::StringToULong(parallel.c_str(), &numJobs)) {
          if (numJobs == 0) {
            std::cerr << "The CMAKE_BUILD_PARALLEL_LEVEL environment variable "
                         "requires a positive integer argument.\n\n";
            dir.clear();
          } else if (numJobs > INT_MAX) {
            std::cerr << "The CMAKE_BUILD_PARALLEL_LEVEL environment variable "
                         "is too large.\n\n";
            dir.clear();
          } else {
            jobs = int(numJobs);
          }
        } else {
          std::cerr << "'CMAKE_BUILD_PARALLEL_LEVEL' environment variable\n"
                    << "invalid number '" << parallel << "' given.\n\n";
          dir.clear();
        }
      }
    }
  }

  if (dir.empty()) {
    /* clang-format off */
    std::cerr <<
      "Usage: cmake --build <dir> [options] [-- [native-options]]\n"
      "Options:\n"
      CMAKE_BUILD_OPTIONS
      ;
    /* clang-format on */
    return 1;
  }

  cmake cm(cmake::RoleInternal, cmState::Project);
  cmSystemTools::SetMessageCallback(
    [&cm](const std::string& msg, const char* title) {
      cmakemainMessageCallback(msg, title, &cm);
    });
  cm.SetProgressCallback([&cm](const std::string& msg, float prog) {
    cmakemainProgressCallback(msg, prog, &cm);
  });
  return cm.Build(jobs, dir, targets, config, nativeOptions, cleanFirst,
                  verbose);
#endif
}